

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState state;
  uint error;
  size_t in_stack_fffffffffffffde0;
  uchar *in_stack_fffffffffffffde8;
  LodePNGState *in_stack_fffffffffffffdf0;
  uint *in_stack_fffffffffffffdf8;
  uint *in_stack_fffffffffffffe00;
  uchar **in_stack_fffffffffffffe08;
  
  lodepng_state_init((LodePNGState *)0x168fe6);
  uVar1 = lodepng_decode(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  lodepng_state_cleanup((LodePNGState *)0x169041);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
  size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}